

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O2

CommandSignature __thiscall llbuild::buildsystem::Command::getSignature(Command *this)

{
  CommandSignature *pCVar1;
  CommandSignature local_8;
  
  local_8.value = 0;
  pCVar1 = llbuild::basic::CommandSignature::combine(&local_8,&this->name);
  return (CommandSignature)pCVar1->value;
}

Assistant:

basic::CommandSignature Command::getSignature() const {
  return basic::CommandSignature().combine(name);
}